

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall Variable_parentOfVariable_Test::TestBody(Variable_parentOfVariable_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  AssertHelper local_70 [8];
  Message local_68 [8];
  shared_ptr<libcellml::ParentedEntity> local_60;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  undefined1 local_30 [8];
  VariablePtr v;
  ComponentPtr c;
  Variable_parentOfVariable_Test *this_local;
  
  libcellml::Component::create();
  libcellml::Variable::create();
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar2);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::ParentedEntity::parent();
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::ParentedEntity>>
            ((EqHelper<false> *)local_50,"c","v->parent()",
             (shared_ptr<libcellml::Component> *)
             &v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_60);
  std::shared_ptr<libcellml::ParentedEntity>::~shared_ptr(&local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1e9,pcVar3);
    testing::internal::AssertHelper::operator=(local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_30);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Variable, parentOfVariable)
{
    libcellml::ComponentPtr c = libcellml::Component::create();
    libcellml::VariablePtr v = libcellml::Variable::create();
    c->addVariable(v);
    EXPECT_EQ(c, v->parent());
}